

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall benchmark::State::SetIterationTime(State *this,double seconds)

{
  TimerManager *this_00;
  bool bVar1;
  unique_lock<std::mutex> local_28;
  double local_18;
  
  local_18 = seconds;
  if ((anonymous_namespace)::running_benchmark != '\0') {
    internal::GetNullLogInstance();
    this_00 = (anonymous_namespace)::timer_manager;
    local_28._M_device = (mutex_type *)(anonymous_namespace)::timer_manager;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    bVar1 = anon_unknown_1::TimerManager::Barrier(this_00,(MutexLock *)&local_28);
    if (bVar1) {
      this_00->manual_time_used_ = local_18 + this_00->manual_time_used_;
      std::unique_lock<std::mutex>::~unique_lock(&local_28);
      std::condition_variable::notify_all();
    }
    else {
      std::unique_lock<std::mutex>::~unique_lock(&local_28);
    }
    return;
  }
  internal::CheckHandler::CheckHandler
            ((CheckHandler *)&local_28,"running_benchmark",
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
             ,"SetIterationTime",0x3ef);
  internal::CheckHandler::~CheckHandler((CheckHandler *)&local_28);
}

Assistant:

void State::SetIterationTime(double seconds)
{
  CHECK(running_benchmark);
  timer_manager->SetIterationTime(seconds);
}